

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

bool fmt::v11::detail::write_loc(appender out,loc_value value,format_specs *specs,locale_ref loc)

{
  bool bVar1;
  undefined1 uVar2;
  format_facet<std::locale> *pfVar3;
  locale locale;
  locale local_a0 [8];
  void *local_98;
  format_facet<std::locale> local_90;
  
  local_98 = loc.locale_;
  locale_ref::get<std::locale>((locale_ref *)local_a0);
  bVar1 = std::has_facet<fmt::v11::format_facet<std::locale>>(local_a0);
  if (bVar1) {
    pfVar3 = std::use_facet<fmt::v11::format_facet<std::locale>>(local_a0);
    uVar2 = (**(code **)(*(long *)pfVar3 + 0x10))(pfVar3,out.container,specs);
  }
  else {
    format_facet<std::locale>::format_facet(&local_90,local_a0);
    uVar2 = (**(code **)(local_90._0_8_ + 0x10))(&local_90,out.container,specs);
    format_facet<std::locale>::~format_facet(&local_90);
  }
  std::locale::~locale(local_a0);
  return (bool)uVar2;
}

Assistant:

FMT_FUNC auto write_loc(appender out, loc_value value,
                        const format_specs& specs, locale_ref loc) -> bool {
  auto locale = loc.get<std::locale>();
  // We cannot use the num_put<char> facet because it may produce output in
  // a wrong encoding.
  using facet = format_facet<std::locale>;
  if (std::has_facet<facet>(locale))
    return use_facet<facet>(locale).put(out, value, specs);
  return facet(locale).put(out, value, specs);
}